

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::C_formatter<spdlog::details::scoped_padder>::format
          (C_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  byte bVar1;
  size_t sVar2;
  buffer<char> *buf;
  ulong uVar3;
  uint uVar4;
  basic_string_view<char> fmt;
  type args;
  scoped_padder p;
  scoped_padder local_50;
  ulong local_28 [2];
  
  scoped_padder::scoped_padder(&local_50,2,&(this->super_flag_formatter).padinfo_,dest);
  uVar4 = tm_time->tm_year % 100;
  if (uVar4 < 100) {
    sVar2 = (dest->super_buffer<char>).size_;
    uVar3 = sVar2 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar3) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar2 = (dest->super_buffer<char>).size_;
      uVar3 = sVar2 + 1;
    }
    bVar1 = (byte)((uVar4 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar3;
    (dest->super_buffer<char>).ptr_[sVar2] = bVar1 | 0x30;
    sVar2 = (dest->super_buffer<char>).size_;
    uVar3 = sVar2 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar3) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar2 = (dest->super_buffer<char>).size_;
      uVar3 = sVar2 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar3;
    (dest->super_buffer<char>).ptr_[sVar2] = (char)uVar4 + bVar1 * -10 | 0x30;
  }
  else {
    ::fmt::v10::detail::check_format_string<int_&,_FMT_COMPILE_STRING,_0>();
    local_28[0] = (ulong)uVar4;
    fmt.size_ = 5;
    fmt.data_ = "{:02}";
    args.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_28;
    args.desc_ = 1;
    ::fmt::v10::detail::vformat_to<char>(&dest->super_buffer<char>,fmt,args,(locale_ref)0x0);
  }
  scoped_padder::~scoped_padder(&local_50);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 2;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad2(tm_time.tm_year % 100, dest);
    }